

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O1

uchar * __thiscall
CVmRun::eval_prop_val
          (CVmRun *this,int found,uint caller_ofs,vm_val_t *val,vm_obj_id_t self,
          vm_prop_id_t target_prop,vm_val_t *orig_target_obj,vm_obj_id_t defining_obj,uint argc,
          vm_rcdesc *rc)

{
  vm_obj_id_t vVar1;
  vm_datatype_t *pvVar2;
  vm_val_t *pvVar3;
  int iVar4;
  uchar *puVar5;
  vm_val_t local_40;
  
  pvVar3 = sp_;
  if (found == 0) {
    sp_ = sp_ + -(long)(int)argc;
    r0_.typ = VM_NIL;
    goto LAB_001eed55;
  }
  switch(val->typ) {
  case VM_DSTRING:
    if (argc != 0) {
LAB_001eede5:
      err_throw(0x899);
    }
    vVar1 = (val->val).obj;
    pvVar2 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar2 = VM_SSTRING;
    (pvVar3->val).obj = vVar1;
    break;
  default:
    if (argc != 0) goto LAB_001eede5;
    r0_ = *val;
    goto LAB_001eed55;
  case VM_CODEOFS:
    pvVar2 = &sp_->typ;
    sp_ = sp_ + 5;
    *pvVar2 = VM_PROP;
    (pvVar3->val).prop = target_prop;
    vVar1 = (orig_target_obj->val).obj;
    pvVar3[1].typ = VM_OBJ;
    pvVar3[1].val.obj = vVar1;
    pvVar3[2].typ = VM_OBJ;
    pvVar3[2].val.obj = defining_obj;
    pvVar3[3].typ = VM_OBJ;
    pvVar3[3].val.obj = self;
    vVar1 = (val->val).obj;
    pvVar3[4].typ = VM_FUNCPTR;
    pvVar3[4].val.obj = vVar1;
    puVar5 = do_call(this,caller_ofs,
                     (uchar *)(G_code_pool_X.super_CVmPoolPaged.pages_
                               [(val->val).obj >>
                                ((byte)G_code_pool_X.super_CVmPoolPaged.log2_page_size_ & 0x1f)].mem
                              + (G_code_pool_X.super_CVmPoolPaged._8_4_ - 1 & (val->val).obj)),argc,
                     rc);
    return puVar5;
  case VM_OBJX:
    iVar4 = (**(code **)(*(long *)&G_obj_table_X.pages_[(val->val).obj >> 0xc]
                                   [(val->val).obj & 0xfff].ptr_ + 0x70))
                      (G_obj_table_X.pages_[(val->val).obj >> 0xc] + ((val->val).obj & 0xfff),0);
    pvVar3 = sp_;
    if (iVar4 != 0) {
      pvVar2 = &sp_->typ;
      sp_ = sp_ + 5;
      *pvVar2 = VM_PROP;
      (pvVar3->val).prop = target_prop;
      vVar1 = (orig_target_obj->val).obj;
      pvVar3[1].typ = VM_OBJ;
      pvVar3[1].val.obj = vVar1;
      pvVar3[2].typ = VM_OBJ;
      pvVar3[2].val.obj = defining_obj;
      pvVar3[3].typ = VM_OBJ;
      pvVar3[3].val.obj = self;
      vVar1 = (val->val).obj;
      pvVar3[4].typ = VM_OBJ;
      pvVar3[4].val.obj = vVar1;
      local_40.val.obj = (val->val).obj;
      local_40.typ = VM_OBJ;
      puVar5 = call_func_ptr_fr(this,&local_40,argc,(vm_rcdesc *)0x0,caller_ofs);
      return puVar5;
    }
    iVar4 = (**(code **)(*(long *)&G_obj_table_X.pages_[(val->val).obj >> 0xc]
                                   [(val->val).obj & 0xfff].ptr_ + 8))
                      (G_obj_table_X.pages_[(val->val).obj >> 0xc] + ((val->val).obj & 0xfff),
                       CVmObjString::metaclass_reg_);
    pvVar3 = sp_;
    if (iVar4 == 0) {
      err_throw(0x89d);
    }
    vVar1 = (val->val).obj;
    pvVar2 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar2 = VM_OBJ;
    (pvVar3->val).obj = vVar1;
    break;
  case VM_BIFPTRX:
    CVmBifTable::call_func
              (G_bif_table_X,(uint)(val->val).prop,(uint)(val->val).bifptr.func_idx,argc);
LAB_001eed55:
    return entry_ptr_native_ + caller_ofs;
  }
  puVar5 = disp_string_val(this,caller_ofs,self);
  return puVar5;
}

Assistant:

const uchar *CVmRun::eval_prop_val(VMG_ int found, uint caller_ofs,
                                   const vm_val_t *val,
                                   vm_obj_id_t self,
                                   vm_prop_id_t target_prop,
                                   const vm_val_t *orig_target_obj,
                                   vm_obj_id_t defining_obj,
                                   uint argc, const vm_rcdesc *rc)
{
    /* check whether or not the property is defined */
    if (found)
    {
        /* take appropriate action based on the datatype of the result */
        switch(val->typ)
        {
        case VM_CODEOFS:
            /* 
             *   It's a method - invoke the method.  This will set us up
             *   to start executing this new code, so there's nothing more
             *   we need to do here.  
             */

            /* push targetprop, targetobj, definingobj, self, and invokee */
            {
                vm_val_t *fp = push(5);
                (fp++)->set_propid(target_prop);
                (fp++)->set_obj(orig_target_obj->val.obj);
                (fp++)->set_obj(defining_obj);
                (fp++)->set_obj(self);
                (fp++)->set_fnptr(val->val.ofs);
            }

            /* call the function */
            return do_call(vmg_ caller_ofs,
                           (const uchar *)G_code_pool->get_ptr(val->val.ofs),
                           argc, rc);
            
        case VM_DSTRING:
            /* no arguments are allowed */
            if (argc != 0)
                err_throw(VMERR_WRONG_NUM_OF_ARGS);
            
            /* 
             *   it's a self-printing string - invoke the default string
             *   output function (this is effectively a do_call()) 
             */
            return disp_dstring(vmg_ val->val.ofs, caller_ofs, self);

        case VM_OBJX:
            /* 
             *   Execute-on-eval object.  If the value is an anonymous
             *   function or other invokable object, call it.  If it's a
             *   string, print it.  
             */
            if (vm_objp(vmg_ val->val.obj)->get_invoker(vmg_ 0))
            {
                /* push targetprop, targetobj, definingobj, self, invokee */
                vm_val_t *fp = push(5);
                (fp++)->set_propid(target_prop);
                (fp++)->set_obj(orig_target_obj->val.obj);
                (fp++)->set_obj(defining_obj);
                (fp++)->set_obj(self);
                (fp++)->set_obj(val->val.obj);

                /* convert to an ordinary anonymous function object */
                vm_val_t funcptr;
                funcptr.set_obj(val->val.obj);

                /* invoke it */
                return call_func_ptr_fr(vmg_ &funcptr, argc, 0, caller_ofs);
            }
            else if (CVmObjString::is_string_obj(vmg_ val->val.obj))
            {
                /* print the string */
                push_obj(vmg_ val->val.obj);
                return disp_string_val(vmg_ caller_ofs, self);
            }
            err_throw(VMERR_BAD_TYPE_CALL);

        case VM_BIFPTRX:
            /* Execute-on-eval built-in function.  Call the function. */
            call_bif(vmg_ val->val.bifptr.set_idx,
                     val->val.bifptr.func_idx, argc);

            /* resume execution where we left off */
            return entry_ptr_native_ + caller_ofs;
            
        default:
            /* for any other value, no arguments are allowed */
            if (argc != 0)
                err_throw(VMERR_WRONG_NUM_OF_ARGS);
            
            /* store the result in R0 */
            r0_ = *val;

            /* resume execution where we left off */
            return entry_ptr_native_ + caller_ofs;
        }
    }
    else
    {
        /* 
         *   the property or method is not defined - discard arguments and
         *   set R0 to nil
         */
        discard(argc);
        r0_.set_nil();

        /* resume execution where we left off */
        return entry_ptr_native_ + caller_ofs;
    }
}